

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_HRR_Algorithm_Base.cpp
# Opt level: O2

QAMList * __thiscall
OSTEI_HRR_Algorithm_Base::GenerateAMReq
          (QAMList *__return_storage_ptr__,OSTEI_HRR_Algorithm_Base *this,QAM *am,RRStepType rrstep)

{
  int iVar1;
  int iVar2;
  string *this_00;
  undefined1 local_188 [16];
  _Alloc_hider local_178;
  size_type local_170;
  char local_168 [16];
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  char *local_130;
  size_type local_128;
  char local_120 [8];
  undefined8 uStack_118;
  char *local_110;
  size_type local_108;
  char local_100 [8];
  undefined8 uStack_f8;
  char *local_f0;
  size_type local_e8;
  char local_e0 [8];
  undefined8 uStack_d8;
  char *local_d0;
  size_type local_c8;
  char local_c0 [8];
  undefined8 uStack_b8;
  char *local_b0;
  size_type local_a8;
  char local_a0 [8];
  undefined8 uStack_98;
  char *local_90;
  size_type local_88;
  char local_80 [8];
  undefined8 uStack_78;
  char *local_70;
  size_type local_68;
  char local_60 [8];
  undefined8 uStack_58;
  char *local_50;
  size_type local_48;
  char local_40 [8];
  undefined8 uStack_38;
  
  (__return_storage_ptr__->super__Vector_base<QAM,_std::allocator<QAM>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<QAM,_std::allocator<QAM>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<QAM,_std::allocator<QAM>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  switch(rrstep) {
  case I:
    local_158 = *(undefined8 *)(am->qam)._M_elems;
    uStack_150 = 0;
    local_148 = *(undefined8 *)((am->qam)._M_elems + 2);
    uStack_140 = 0;
    std::__cxx11::string::string((string *)&local_50,(string *)&am->tag);
    local_188._0_4_ = (int)local_158 + -1;
    local_188._4_4_ = local_158._4_4_ + 1;
    local_188._8_4_ = (undefined4)local_148;
    local_188._12_4_ = (undefined4)((ulong)local_148 >> 0x20);
    if (local_50 == local_40) {
      local_168[8] = (undefined1)uStack_38;
      local_168[9] = uStack_38._1_1_;
      local_168[10] = uStack_38._2_1_;
      local_168[0xb] = uStack_38._3_1_;
      local_168[0xc] = uStack_38._4_1_;
      local_168[0xd] = uStack_38._5_1_;
      local_168[0xe] = uStack_38._6_1_;
      local_168[0xf] = uStack_38._7_1_;
      local_178._M_p = local_168;
    }
    else {
      local_178._M_p = local_50;
    }
    local_170 = local_48;
    local_48 = 0;
    local_40[0] = '\0';
    local_50 = local_40;
    std::vector<QAM,_std::allocator<QAM>_>::emplace_back<QAM>
              (__return_storage_ptr__,(QAM *)local_188);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_50);
    iVar1 = (am->qam)._M_elems[0];
    iVar2 = (am->qam)._M_elems[3];
    local_158 = *(undefined8 *)((am->qam)._M_elems + 1);
    uStack_150 = 0;
    std::__cxx11::string::string((string *)&local_70,(string *)&am->tag);
    local_188._0_4_ = iVar1 + -1;
    local_188._4_4_ = (undefined4)local_158;
    local_188._8_4_ = (undefined4)((ulong)local_158 >> 0x20);
    if (local_70 == local_60) {
      local_168[8] = (undefined1)uStack_58;
      local_168[9] = uStack_58._1_1_;
      local_168[10] = uStack_58._2_1_;
      local_168[0xb] = uStack_58._3_1_;
      local_168[0xc] = uStack_58._4_1_;
      local_168[0xd] = uStack_58._5_1_;
      local_168[0xe] = uStack_58._6_1_;
      local_168[0xf] = uStack_58._7_1_;
      local_178._M_p = local_168;
    }
    else {
      local_178._M_p = local_70;
    }
    local_170 = local_68;
    local_68 = 0;
    local_60[0] = '\0';
    local_188._12_4_ = iVar2;
    local_70 = local_60;
    std::vector<QAM,_std::allocator<QAM>_>::emplace_back<QAM>
              (__return_storage_ptr__,(QAM *)local_188);
    std::__cxx11::string::~string((string *)&local_178);
    this_00 = (string *)&local_70;
    break;
  case J:
    local_158 = *(undefined8 *)(am->qam)._M_elems;
    uStack_150 = 0;
    local_148 = *(undefined8 *)((am->qam)._M_elems + 2);
    uStack_140 = 0;
    std::__cxx11::string::string((string *)&local_90,(string *)&am->tag);
    local_188._0_4_ = (int)local_158 + 1;
    local_188._4_4_ = local_158._4_4_ + -1;
    local_188._8_4_ = (undefined4)local_148;
    local_188._12_4_ = (undefined4)((ulong)local_148 >> 0x20);
    if (local_90 == local_80) {
      local_168[8] = (undefined1)uStack_78;
      local_168[9] = uStack_78._1_1_;
      local_168[10] = uStack_78._2_1_;
      local_168[0xb] = uStack_78._3_1_;
      local_168[0xc] = uStack_78._4_1_;
      local_168[0xd] = uStack_78._5_1_;
      local_168[0xe] = uStack_78._6_1_;
      local_168[0xf] = uStack_78._7_1_;
      local_178._M_p = local_168;
    }
    else {
      local_178._M_p = local_90;
    }
    local_170 = local_88;
    local_88 = 0;
    local_80[0] = '\0';
    local_90 = local_80;
    std::vector<QAM,_std::allocator<QAM>_>::emplace_back<QAM>
              (__return_storage_ptr__,(QAM *)local_188);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_90);
    iVar1 = (am->qam)._M_elems[0];
    iVar2 = (am->qam)._M_elems[1];
    local_158 = *(undefined8 *)((am->qam)._M_elems + 2);
    uStack_150 = 0;
    std::__cxx11::string::string((string *)&local_b0,(string *)&am->tag);
    local_188._4_4_ = iVar2 + -1;
    local_188._8_4_ = (undefined4)local_158;
    local_188._12_4_ = (undefined4)((ulong)local_158 >> 0x20);
    if (local_b0 == local_a0) {
      local_168[8] = (undefined1)uStack_98;
      local_168[9] = uStack_98._1_1_;
      local_168[10] = uStack_98._2_1_;
      local_168[0xb] = uStack_98._3_1_;
      local_168[0xc] = uStack_98._4_1_;
      local_168[0xd] = uStack_98._5_1_;
      local_168[0xe] = uStack_98._6_1_;
      local_168[0xf] = uStack_98._7_1_;
      local_178._M_p = local_168;
    }
    else {
      local_178._M_p = local_b0;
    }
    local_170 = local_a8;
    local_a8 = 0;
    local_a0[0] = '\0';
    local_188._0_4_ = iVar1;
    local_b0 = local_a0;
    std::vector<QAM,_std::allocator<QAM>_>::emplace_back<QAM>
              (__return_storage_ptr__,(QAM *)local_188);
    std::__cxx11::string::~string((string *)&local_178);
    this_00 = (string *)&local_b0;
    break;
  case K:
    local_158 = *(undefined8 *)(am->qam)._M_elems;
    uStack_150 = 0;
    local_148 = *(undefined8 *)((am->qam)._M_elems + 2);
    uStack_140 = 0;
    std::__cxx11::string::string((string *)&local_d0,(string *)&am->tag);
    local_188._8_4_ = (int)local_148 + -1;
    local_188._12_4_ = local_148._4_4_ + 1;
    local_188._0_4_ = (undefined4)local_158;
    local_188._4_4_ = (undefined4)((ulong)local_158 >> 0x20);
    if (local_d0 == local_c0) {
      local_168[8] = (undefined1)uStack_b8;
      local_168[9] = uStack_b8._1_1_;
      local_168[10] = uStack_b8._2_1_;
      local_168[0xb] = uStack_b8._3_1_;
      local_168[0xc] = uStack_b8._4_1_;
      local_168[0xd] = uStack_b8._5_1_;
      local_168[0xe] = uStack_b8._6_1_;
      local_168[0xf] = uStack_b8._7_1_;
      local_178._M_p = local_168;
    }
    else {
      local_178._M_p = local_d0;
    }
    local_170 = local_c8;
    local_c8 = 0;
    local_c0[0] = '\0';
    local_d0 = local_c0;
    std::vector<QAM,_std::allocator<QAM>_>::emplace_back<QAM>
              (__return_storage_ptr__,(QAM *)local_188);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_d0);
    local_158 = *(undefined8 *)(am->qam)._M_elems;
    uStack_150 = 0;
    iVar1 = (am->qam)._M_elems[2];
    iVar2 = (am->qam)._M_elems[3];
    std::__cxx11::string::string((string *)&local_f0,(string *)&am->tag);
    local_188._8_4_ = iVar1 + -1;
    local_188._0_4_ = (undefined4)local_158;
    local_188._4_4_ = (undefined4)((ulong)local_158 >> 0x20);
    if (local_f0 == local_e0) {
      local_168[8] = (undefined1)uStack_d8;
      local_168[9] = uStack_d8._1_1_;
      local_168[10] = uStack_d8._2_1_;
      local_168[0xb] = uStack_d8._3_1_;
      local_168[0xc] = uStack_d8._4_1_;
      local_168[0xd] = uStack_d8._5_1_;
      local_168[0xe] = uStack_d8._6_1_;
      local_168[0xf] = uStack_d8._7_1_;
      local_178._M_p = local_168;
    }
    else {
      local_178._M_p = local_f0;
    }
    local_170 = local_e8;
    local_e8 = 0;
    local_e0[0] = '\0';
    local_188._12_4_ = iVar2;
    local_f0 = local_e0;
    std::vector<QAM,_std::allocator<QAM>_>::emplace_back<QAM>
              (__return_storage_ptr__,(QAM *)local_188);
    std::__cxx11::string::~string((string *)&local_178);
    this_00 = (string *)&local_f0;
    break;
  case L:
    local_158 = *(undefined8 *)(am->qam)._M_elems;
    uStack_150 = 0;
    local_148 = *(undefined8 *)((am->qam)._M_elems + 2);
    uStack_140 = 0;
    std::__cxx11::string::string((string *)&local_110,(string *)&am->tag);
    local_188._8_4_ = (int)local_148 + 1;
    local_188._12_4_ = local_148._4_4_ + -1;
    local_188._0_4_ = (undefined4)local_158;
    local_188._4_4_ = (undefined4)((ulong)local_158 >> 0x20);
    if (local_110 == local_100) {
      local_168[8] = (undefined1)uStack_f8;
      local_168[9] = uStack_f8._1_1_;
      local_168[10] = uStack_f8._2_1_;
      local_168[0xb] = uStack_f8._3_1_;
      local_168[0xc] = uStack_f8._4_1_;
      local_168[0xd] = uStack_f8._5_1_;
      local_168[0xe] = uStack_f8._6_1_;
      local_168[0xf] = uStack_f8._7_1_;
      local_178._M_p = local_168;
    }
    else {
      local_178._M_p = local_110;
    }
    local_170 = local_108;
    local_108 = 0;
    local_100[0] = '\0';
    local_110 = local_100;
    std::vector<QAM,_std::allocator<QAM>_>::emplace_back<QAM>
              (__return_storage_ptr__,(QAM *)local_188);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_110);
    local_158 = *(undefined8 *)(am->qam)._M_elems;
    uStack_150 = 0;
    iVar1 = (am->qam)._M_elems[2];
    iVar2 = (am->qam)._M_elems[3];
    std::__cxx11::string::string((string *)&local_130,(string *)&am->tag);
    local_188._12_4_ = iVar2 + -1;
    local_188._0_4_ = (undefined4)local_158;
    local_188._4_4_ = (undefined4)((ulong)local_158 >> 0x20);
    if (local_130 == local_120) {
      local_168[8] = (undefined1)uStack_118;
      local_168[9] = uStack_118._1_1_;
      local_168[10] = uStack_118._2_1_;
      local_168[0xb] = uStack_118._3_1_;
      local_168[0xc] = uStack_118._4_1_;
      local_168[0xd] = uStack_118._5_1_;
      local_168[0xe] = uStack_118._6_1_;
      local_168[0xf] = uStack_118._7_1_;
      local_178._M_p = local_168;
    }
    else {
      local_178._M_p = local_130;
    }
    local_170 = local_128;
    local_128 = 0;
    local_120[0] = '\0';
    local_188._8_4_ = iVar1;
    local_130 = local_120;
    std::vector<QAM,_std::allocator<QAM>_>::emplace_back<QAM>
              (__return_storage_ptr__,(QAM *)local_188);
    std::__cxx11::string::~string((string *)&local_178);
    this_00 = (string *)&local_130;
    break;
  default:
    goto switchD_00112cf7_default;
  }
  std::__cxx11::string::~string(this_00);
switchD_00112cf7_default:
  return __return_storage_ptr__;
}

Assistant:

QAMList OSTEI_HRR_Algorithm_Base::GenerateAMReq(QAM am, RRStepType rrstep) const
{
    QAMList req;
    switch(rrstep)
    {
        case RRStepType::I:
            req.push_back({am[0]-1, am[1]+1, am[2]  , am[3]  , am.tag });
            req.push_back({am[0]-1, am[1]  , am[2]  , am[3]  , am.tag });
            break;
        case RRStepType::J:
            req.push_back({am[0]+1, am[1]-1, am[2]  , am[3]  , am.tag });
            req.push_back({am[0]  , am[1]-1, am[2]  , am[3]  , am.tag });
            break;
        case RRStepType::K:
            req.push_back({am[0]  , am[1]  , am[2]-1, am[3]+1, am.tag});
            req.push_back({am[0]  , am[1]  , am[2]-1, am[3]  , am.tag});
            break;
        case RRStepType::L:
            req.push_back({am[0]  , am[1]  , am[2]+1, am[3]-1, am.tag});
            req.push_back({am[0]  , am[1]  , am[2]  , am[3]-1, am.tag});
            break;
    }

    return req;
}